

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O2

double mjs::anon_unknown_37::date_helper::time_from_args
                 (vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value *v;
  pointer pvVar1;
  double dVar2;
  double dVar3;
  double month;
  double day;
  double hour;
  double min;
  double sec;
  double dVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  v = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_start;
  if ((ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)v) / 0x28) < 3) {
    __assert_fail("args.size() >= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/date_object.cpp"
                  ,0x92,
                  "static double mjs::(anonymous namespace)::date_helper::time_from_args(const std::vector<value> &)"
                 );
  }
  dVar2 = to_number(v);
  dVar3 = to_integer(dVar2);
  month = to_number((args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                    super__Vector_impl_data._M_start + 1);
  day = to_number((args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                  super__Vector_impl_data._M_start + 2);
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  sec = 0.0;
  hour = 0.0;
  min = 0.0;
  uVar5 = 0;
  uVar6 = 0;
  if (3 < (ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl
                         .super__Vector_impl_data._M_finish - (long)pvVar1) / 0x28)) {
    hour = to_number(pvVar1 + 3);
    pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pvVar1) / 0x28) < 5) {
      min = 0.0;
    }
    else {
      min = to_number(pvVar1 + 4);
      pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (5 < (ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x28)) {
        sec = to_number(pvVar1 + 5);
        pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x28) < 7) {
          uVar5 = 0;
          uVar6 = 0;
        }
        else {
          dVar4 = to_number(pvVar1 + 6);
          uVar5 = SUB84(dVar4,0);
          uVar6 = (undefined4)((ulong)dVar4 >> 0x20);
        }
        goto LAB_0015ce2c;
      }
    }
    uVar6 = 0;
    uVar5 = 0;
    sec = 0.0;
  }
LAB_0015ce2c:
  dVar2 = make_day((double)(~-(ulong)(dVar3 <= 99.0) & (ulong)dVar2 |
                           (~-(ulong)(!NAN(dVar2) && !NAN(dVar2)) & (ulong)dVar2 |
                           (~-(ulong)(0.0 <= dVar3) & (ulong)dVar2 |
                           (ulong)(dVar3 + 1900.0) & -(ulong)(0.0 <= dVar3)) &
                           -(ulong)(!NAN(dVar2) && !NAN(dVar2))) & -(ulong)(dVar3 <= 99.0)),month,
                   day);
  dVar3 = make_time(hour,min,sec,(double)CONCAT44(uVar6,uVar5));
  if ((ulong)ABS(dVar3) < 0x7ff0000000000000) {
    dVar3 = dVar2 * 86400000.0 + dVar3;
  }
  else {
    dVar3 = NAN;
  }
  if (0x7fefffffffffffff < (ulong)ABS(dVar2)) {
    dVar3 = NAN;
  }
  return dVar3;
}

Assistant:

static double time_from_args(const std::vector<value>& args) {
        assert(args.size() >= 3);
        double year = to_number(args[0]);
        if (double iyear = to_integer(year); !std::isnan(year) && iyear >= 0 && iyear <= 99) {
            year = iyear + 1900;
        }
        const double month   = to_number(args[1]);
        const double day     = to_number(args[2]);
        const double hours   = args.size() > 3 ? to_number(args[3]) : 0;
        const double minutes = args.size() > 4 ? to_number(args[4]) : 0;
        const double seconds = args.size() > 5 ? to_number(args[5]) : 0;
        const double ms      = args.size() > 6 ? to_number(args[6]) : 0;
        return date_helper::make_date(date_helper::make_day(year, month, day), date_helper::make_time(hours, minutes, seconds, ms));
    }